

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall
llvm::cl::generic_parser_base::printOptionInfo
          (generic_parser_base *this,Option *O,size_t GlobalWidth)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  raw_ostream *prVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int extraout_EDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  size_t extraout_RDX_01;
  char *extraout_RDX_02;
  size_t in_R8;
  uint uVar5;
  ulong uVar6;
  StringRef Str;
  StringRef HelpStr;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef HelpStr_00;
  
  if ((O->ArgStr).Length == 0) {
    if ((O->HelpStr).Length != 0) {
      prVar4 = outs();
      Str_04.Length = 2;
      Str_04.Data = "  ";
      prVar4 = raw_ostream::operator<<(prVar4,Str_04);
      prVar4 = raw_ostream::operator<<(prVar4,O->HelpStr);
      pcVar1 = prVar4->OutBufCur;
      if (pcVar1 < prVar4->OutBufEnd) {
        prVar4->OutBufCur = pcVar1 + 1;
        *pcVar1 = '\n';
      }
      else {
        raw_ostream::write(prVar4,10,__buf_00,(size_t)pcVar1);
      }
    }
    uVar2 = (*this->_vptr_generic_parser_base[2])(this);
    if (uVar2 != 0) {
      uVar6 = 0;
      do {
        iVar3 = (*this->_vptr_generic_parser_base[3])(this,uVar6);
        Str_06.Data._4_4_ = extraout_var_01;
        Str_06.Data._0_4_ = iVar3;
        prVar4 = outs();
        Str_05.Length = 5;
        Str_05.Data = "    -";
        prVar4 = raw_ostream::operator<<(prVar4,Str_05);
        Str_06.Length = extraout_RDX_01;
        raw_ostream::operator<<(prVar4,Str_06);
        iVar3 = (*this->_vptr_generic_parser_base[4])(this,uVar6);
        HelpStr_00.Length = GlobalWidth;
        HelpStr_00.Data = extraout_RDX_02;
        Option::printHelpStr
                  ((Option *)CONCAT44(extraout_var_02,iVar3),HelpStr_00,extraout_RDX_01 + 8,in_R8);
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
      } while (uVar2 != uVar5);
    }
  }
  else {
    prVar4 = outs();
    Str.Length = 3;
    Str.Data = "  -";
    prVar4 = raw_ostream::operator<<(prVar4,Str);
    raw_ostream::operator<<(prVar4,O->ArgStr);
    HelpStr.Length = GlobalWidth;
    HelpStr.Data = (char *)(O->HelpStr).Length;
    Option::printHelpStr((Option *)(O->HelpStr).Data,HelpStr,(O->ArgStr).Length + 6,in_R8);
    uVar2 = (*this->_vptr_generic_parser_base[2])(this);
    if (uVar2 != 0) {
      uVar6 = 0;
      do {
        (*this->_vptr_generic_parser_base[3])(this,uVar6);
        prVar4 = outs();
        Str_00.Length = 5;
        Str_00.Data = "    =";
        prVar4 = raw_ostream::operator<<(prVar4,Str_00);
        iVar3 = (*this->_vptr_generic_parser_base[3])(this,uVar6);
        Str_01.Data._4_4_ = extraout_var;
        Str_01.Data._0_4_ = iVar3;
        Str_01.Length = extraout_RDX;
        raw_ostream::operator<<(prVar4,Str_01);
        prVar4 = outs();
        prVar4 = raw_ostream::indent(prVar4,((int)GlobalWidth - extraout_EDX) - 8);
        Str_02.Length = 5;
        Str_02.Data = " -   ";
        prVar4 = raw_ostream::operator<<(prVar4,Str_02);
        iVar3 = (*this->_vptr_generic_parser_base[4])(this,uVar6);
        Str_03.Data._4_4_ = extraout_var_00;
        Str_03.Data._0_4_ = iVar3;
        Str_03.Length = extraout_RDX_00;
        prVar4 = raw_ostream::operator<<(prVar4,Str_03);
        pcVar1 = prVar4->OutBufCur;
        if (pcVar1 < prVar4->OutBufEnd) {
          prVar4->OutBufCur = pcVar1 + 1;
          *pcVar1 = '\n';
        }
        else {
          raw_ostream::write(prVar4,10,__buf,(size_t)pcVar1);
        }
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
      } while (uVar2 != uVar5);
    }
  }
  return;
}

Assistant:

void generic_parser_base::printOptionInfo(const Option &O,
                                          size_t GlobalWidth) const {
  if (O.hasArgStr()) {
    outs() << "  -" << O.ArgStr;
    Option::printHelpStr(O.HelpStr, GlobalWidth, O.ArgStr.size() + 6);

    for (unsigned i = 0, e = getNumOptions(); i != e; ++i) {
      size_t NumSpaces = GlobalWidth - getOption(i).size() - 8;
      outs() << "    =" << getOption(i);
      outs().indent(NumSpaces) << " -   " << getDescription(i) << '\n';
    }
  } else {
    if (!O.HelpStr.empty())
      outs() << "  " << O.HelpStr << '\n';
    for (unsigned i = 0, e = getNumOptions(); i != e; ++i) {
      auto Option = getOption(i);
      outs() << "    -" << Option;
      Option::printHelpStr(getDescription(i), GlobalWidth, Option.size() + 8);
    }
  }
}